

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O0

FT_UInt sfnt_get_name_index(FT_Face face,FT_String *glyph_name)

{
  FT_Error FVar1;
  int iVar2;
  char *pcStack_38;
  FT_Error error;
  FT_String *gname;
  FT_UInt max_gid;
  FT_UInt i;
  TT_Face ttface;
  FT_String *glyph_name_local;
  FT_Face face_local;
  
  gname._0_4_ = 0xffffffff;
  if (-1 < face->num_glyphs) {
    if ((ulong)face->num_glyphs < 0xffffffff) {
      gname._0_4_ = (uint)face->num_glyphs;
    }
    _max_gid = (TT_Face)face;
    ttface = (TT_Face)glyph_name;
    glyph_name_local = (FT_String *)face;
    for (gname._4_4_ = 0; gname._4_4_ < (uint)gname; gname._4_4_ = gname._4_4_ + 1) {
      FVar1 = tt_face_get_ps_name(_max_gid,gname._4_4_,&stack0xffffffffffffffc8);
      if ((FVar1 == 0) && (iVar2 = strcmp((char *)ttface,pcStack_38), iVar2 == 0)) {
        return gname._4_4_;
      }
    }
  }
  return 0;
}

Assistant:

static FT_UInt
  sfnt_get_name_index( FT_Face           face,
                       const FT_String*  glyph_name )
  {
    TT_Face  ttface = (TT_Face)face;

    FT_UInt  i, max_gid = FT_UINT_MAX;


    if ( face->num_glyphs < 0 )
      return 0;
    else if ( (FT_ULong)face->num_glyphs < FT_UINT_MAX )
      max_gid = (FT_UInt)face->num_glyphs;
    else
      FT_TRACE0(( "Ignore glyph names for invalid GID 0x%08x - 0x%08lx\n",
                  FT_UINT_MAX, face->num_glyphs ));

    for ( i = 0; i < max_gid; i++ )
    {
      FT_String*  gname;
      FT_Error    error = tt_face_get_ps_name( ttface, i, &gname );


      if ( error )
        continue;

      if ( !ft_strcmp( glyph_name, gname ) )
        return i;
    }

    return 0;
  }